

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O0

void __thiscall
Dense::Dense(Dense *this,int input_size,int output_size,double *nlearning_rate,string *ntype)

{
  rep rVar1;
  Index IVar2;
  long col;
  _func_int **in_RCX;
  Layer *in_RDI;
  string *in_R8;
  result_type rVar3;
  int i_1;
  int j;
  int i;
  normal_distribution<double> distribution;
  default_random_engine generator;
  uint seed;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffea8;
  normal_distribution<double> *in_stack_fffffffffffffeb0;
  result_type in_stack_fffffffffffffeb8;
  normal_distribution<double> *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffed0;
  int local_b0;
  int local_90;
  int local_8c;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  undefined4 local_4c;
  _func_int **local_18;
  
  local_18 = in_RCX;
  Layer::Layer(in_RDI);
  in_RDI->_vptr_Layer = (_func_int **)&PTR_forward_00198870;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x154bcd);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x154be6);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x154c01);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x154c19);
  std::__cxx11::string::string((string *)(in_RDI + 0xe));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x154c78);
  local_60.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_58.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_60);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_58);
  local_4c = (undefined4)rVar1;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_fffffffffffffeb0,(result_type_conflict)in_stack_fffffffffffffea8);
  std::normal_distribution<double>::normal_distribution
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (result_type)in_stack_fffffffffffffeb0);
  local_8c = 0;
  while( true ) {
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x154d21);
    if (IVar2 <= local_8c) break;
    local_90 = 0;
    while( true ) {
      IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x154d64);
      if (IVar2 <= local_90) break;
      rVar3 = std::normal_distribution<double>::operator()
                        (in_stack_fffffffffffffeb0,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         in_stack_fffffffffffffea8);
      in_stack_fffffffffffffed0 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffed0,(Index)in_stack_fffffffffffffec8,
                      (Index)in_stack_fffffffffffffec0);
      *(result_type *)in_stack_fffffffffffffed0 = rVar3;
      local_90 = local_90 + 1;
    }
    local_8c = local_8c + 1;
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x154ec8);
  local_b0 = 0;
  while( true ) {
    col = (long)local_b0;
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x154ef1);
    if (IVar2 <= col) break;
    rVar3 = std::normal_distribution<double>::operator()
                      (in_stack_fffffffffffffeb0,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb0 =
         (normal_distribution<double> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                   (in_stack_fffffffffffffed0,IVar2,col);
    (in_stack_fffffffffffffeb0->_M_param)._M_mean = rVar3;
    local_b0 = local_b0 + 1;
  }
  in_RDI[0xd]._vptr_Layer = local_18;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xe),in_R8);
  return;
}

Assistant:

Dense::Dense(int input_size, int output_size, double* nlearning_rate, string ntype) {
    weigths = Eigen::MatrixXd(input_size, output_size);
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    std::default_random_engine generator (seed);
    std::normal_distribution<double> distribution(0.0,1.0);
    for(int i = 0; i < weigths.rows(); i++) {
        for(int j = 0; j < weigths.cols(); j++) {
            weigths(i,j) = distribution(generator);
        }
    }
    biases = Eigen::MatrixXd(1, output_size);
    for(int i = 0; i < biases.cols(); i++) {
        biases(0,i) = distribution(generator);
    }
    learning_rate = nlearning_rate;
    type = ntype;
}